

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

int uriCommonTest(char *filename,char *result,char *err,char *base)

{
  uint uVar1;
  int iVar2;
  char *__filename;
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  char str [1024];
  undefined8 local_440;
  char local_438 [1032];
  
  pcVar3 = filename;
  __filename = resultFilename(filename,temp_directory,".res");
  if (__filename == (char *)0x0) {
    uriCommonTest_cold_1();
    iVar7 = 0;
    if ((pcVar3 != (char *)0x0) &&
       (iVar2 = strcmp(pcVar3,"file:///usr/local/etc/xml/catalog"), iVar7 = 0, iVar2 != 0)) {
      iVar2 = strcmp(urip_rcvsURLs[urip_current],pcVar3);
      iVar7 = 1;
      if (iVar2 != 0) {
        urip_success = 1;
      }
    }
    return iVar7;
  }
  __stream = fopen64(__filename,"wb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"failed to open output file %s\n",__filename);
  }
  else {
    __stream_00 = fopen64(filename,"rb");
    if (__stream_00 != (FILE *)0x0) {
      local_440 = result;
      pcVar3 = fgets(local_438,0x3ff,__stream_00);
      if (pcVar3 != (char *)0x0) {
        do {
          sVar4 = strlen(local_438);
          if (0 < (int)(uint)sVar4) {
            lVar5 = (ulong)((uint)sVar4 & 0x7fffffff) + 1;
            do {
              if ((0x20 < (ulong)(byte)local_438[lVar5 + -2]) ||
                 ((0x100002600U >> ((ulong)(byte)local_438[lVar5 + -2] & 0x3f) & 1) == 0)) break;
              local_438[lVar5 + -2] = '\0';
              lVar5 = lVar5 + -1;
            } while (1 < lVar5);
          }
          nb_tests = nb_tests + 1;
          lVar5 = xmlCreateURI();
          if (base == (char *)0x0) {
            uVar1 = xmlParseURIReference(lVar5,local_438);
            if (uVar1 == 0) {
              xmlNormalizeURIPath(*(undefined8 *)(lVar5 + 0x30));
              xmlPrintURI(__stream,lVar5);
              fputc(10,__stream);
            }
            else {
              fprintf(__stream,"%s : error %d\n",local_438,(ulong)uVar1);
            }
LAB_0010e680:
            lVar6 = 0;
          }
          else {
            lVar6 = xmlBuildURI(local_438,base);
            if (lVar6 == 0) {
              fwrite("::ERROR::\n",10,1,__stream);
              goto LAB_0010e680;
            }
            fprintf(__stream,"%s\n",lVar6);
          }
          if (lVar6 != 0) {
            (*_xmlFree)(lVar6);
          }
          xmlFreeURI(lVar5);
          pcVar3 = fgets(local_438,0x3ff,__stream_00);
        } while (pcVar3 != (char *)0x0);
      }
      fclose(__stream_00);
      fclose(__stream);
      pcVar3 = local_440;
      iVar7 = 0;
      if ((local_440 != (char *)0x0) &&
         (iVar2 = compareFiles(__filename,local_440), iVar7 = 0, iVar2 != 0)) {
        fprintf(_stderr,"Result for %s failed in %s\n",filename,pcVar3);
        iVar7 = 1;
      }
      if ((err != (char *)0x0) &&
         (iVar2 = compareFileMem(err,testErrors,testErrorsSize), iVar2 != 0)) {
        fprintf(_stderr,"Error for %s failed\n",filename);
        iVar7 = 1;
      }
      unlink(__filename);
      goto LAB_0010e743;
    }
    fprintf(_stderr,"failed to open input file %s\n",filename);
    fclose(__stream);
    unlink(__filename);
  }
  iVar7 = -1;
LAB_0010e743:
  free(__filename);
  return iVar7;
}

Assistant:

static int
uriCommonTest(const char *filename,
             const char *result,
             const char *err,
             const char *base) {
    char *temp;
    FILE *o, *f;
    char str[1024];
    int res = 0, i, ret;

    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    o = fopen(temp, "wb");
    if (o == NULL) {
	fprintf(stderr, "failed to open output file %s\n", temp);
        free(temp);
	return(-1);
    }
    f = fopen(filename, "rb");
    if (f == NULL) {
	fprintf(stderr, "failed to open input file %s\n", filename);
	fclose(o);
        if (temp != NULL) {
            unlink(temp);
            free(temp);
        }
	return(-1);
    }

    while (1) {
	/*
	 * read one line in string buffer.
	 */
	if (fgets (&str[0], sizeof (str) - 1, f) == NULL)
	   break;

	/*
	 * remove the ending spaces
	 */
	i = strlen(str);
	while ((i > 0) &&
	       ((str[i - 1] == '\n') || (str[i - 1] == '\r') ||
		(str[i - 1] == ' ') || (str[i - 1] == '\t'))) {
	    i--;
	    str[i] = 0;
	}
	nb_tests++;
	handleURI(str, base, o);
    }

    fclose(f);
    fclose(o);

    if (result != NULL) {
	ret = compareFiles(temp, result);
	if (ret) {
	    fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	    res = 1;
	}
    }
    if (err != NULL) {
	ret = compareFileMem(err, testErrors, testErrorsSize);
	if (ret != 0) {
	    fprintf(stderr, "Error for %s failed\n", filename);
	    res = 1;
	}
    }

    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }
    return(res);
}